

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

void __thiscall Selector::removeListener(Selector *this,int fd,SelectorListener *listener)

{
  bool bVar1;
  iterator iVar2;
  bool bVar3;
  iterator i;
  iterator local_68;
  AutoLock l;
  ListenerNode n;
  
  AutoLock::AutoLock(&l,&this->mLock);
  n.mListener = (SelectorListener *)0x0;
  i.mNode = ((this->mList).mHead)->next;
  bVar3 = false;
  iVar2.mNode = i.mNode;
  n.mFd = fd;
  while (iVar2.mNode != (this->mList).mTail) {
    bVar1 = ListenerNode::operator==((iVar2.mNode)->val,&n);
    if (bVar1) {
      operator_delete((i.mNode)->val,0x18);
      JetHead::list<Selector::ListenerNode_*>::iterator::erase(&local_68);
      i.mNode = local_68.mNode;
      bVar3 = true;
      iVar2.mNode = local_68.mNode;
    }
    else {
      iVar2.mNode = (Node *)0x0;
      if (i.mNode != (Node *)0x0) {
        i.mNode = (i.mNode)->next;
        iVar2.mNode = i.mNode;
      }
    }
  }
  if (bVar3) {
    updateListeners(this);
  }
  AutoLock::~AutoLock(&l);
  return;
}

Assistant:

void Selector::removeListener( int fd, SelectorListener *listener )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	AutoLock l( mLock );
	ListenerNode n( fd, NULL );
	bool update = false;
	
	JetHead::list<ListenerNode*>::iterator i = mList.begin(); 
	while (i != mList.end())
	{
		if (*(*i) == n)
		{
			update = true;
			delete *i;
			i = i.erase();
		} 
		else 
		{
			++i;
		}
	}
		
	if ( update )
	{
		updateListeners();		
	}
}